

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrule.cpp
# Opt level: O1

int32_t __thiscall
icu_63::NFRule::prefixLength
          (NFRule *this,UnicodeString *str,UnicodeString *prefix,UErrorCode *status)

{
  short sVar1;
  ushort uVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int32_t iVar7;
  RuleBasedCollator *pRVar8;
  CollationElementIterator *this_00;
  CollationElementIterator *this_01;
  char16_t *srcChars;
  int srcStart;
  int srcLength;
  LocalPointer<icu_63::CollationElementIterator> strIter;
  LocalPointer<icu_63::CollationElementIterator> prefixIter;
  UErrorCode err;
  UErrorCode local_34;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  sVar1 = (prefix->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar4 = (prefix->fUnion).fFields.fLength;
  }
  else {
    iVar4 = (int)sVar1 >> 5;
  }
  iVar7 = 0;
  if (iVar4 != 0) {
    iVar4 = (*(this->formatter->super_NumberFormat).super_Format.super_UObject._vptr_UObject[0x19])
                      ();
    iVar7 = 0;
    if ((char)iVar4 == '\0') {
      uVar2 = (prefix->fUnion).fStackFields.fLengthAndFlags;
      if ((uVar2 & 1) == 0) {
        if ((short)uVar2 < 0) {
          iVar4 = (prefix->fUnion).fFields.fLength;
        }
        else {
          iVar4 = (int)(short)uVar2 >> 5;
        }
        srcStart = 0;
        if (iVar4 < 0) {
          srcStart = iVar4;
        }
        srcLength = iVar4 - srcStart;
        if (iVar4 <= iVar4 - srcStart) {
          srcLength = iVar4;
        }
        if (iVar4 < 0) {
          srcLength = 0;
        }
        if ((uVar2 & 2) == 0) {
          srcChars = (prefix->fUnion).fFields.fArray;
        }
        else {
          srcChars = (prefix->fUnion).fStackFields.fBuffer;
        }
        bVar3 = UnicodeString::doCompare(str,0,iVar4,srcChars,srcStart,srcLength);
      }
      else {
        bVar3 = ~*(byte *)&str->fUnion & 1;
      }
      if (bVar3 == 0) {
        sVar1 = (prefix->fUnion).fStackFields.fLengthAndFlags;
        if (sVar1 < 0) {
          iVar7 = (prefix->fUnion).fFields.fLength;
        }
        else {
          iVar7 = (int)sVar1 >> 5;
        }
      }
    }
    else {
      pRVar8 = RuleBasedNumberFormat::getCollator(this->formatter);
      if (pRVar8 == (RuleBasedCollator *)0x0) {
        *status = U_MEMORY_ALLOCATION_ERROR;
      }
      else {
        iVar4 = (*(pRVar8->super_Collator).super_UObject._vptr_UObject[0x27])(pRVar8,str);
        this_00 = (CollationElementIterator *)CONCAT44(extraout_var,iVar4);
        iVar4 = (*(pRVar8->super_Collator).super_UObject._vptr_UObject[0x27])(pRVar8);
        this_01 = (CollationElementIterator *)CONCAT44(extraout_var_00,iVar4);
        if (this_01 == (CollationElementIterator *)0x0 || this_00 == (CollationElementIterator *)0x0
           ) {
          *status = U_MEMORY_ALLOCATION_ERROR;
          iVar7 = 0;
        }
        else {
          local_34 = U_ZERO_ERROR;
          uVar5 = CollationElementIterator::next(this_00,&stack0xffffffffffffffcc);
          prefix = (UnicodeString *)&stack0xffffffffffffffcc;
          uVar6 = CollationElementIterator::next(this_01,(UErrorCode *)prefix);
          iVar7 = 0;
          while (uVar6 != 0xffffffff) {
            while (uVar5 < 0x10000) {
              prefix = (UnicodeString *)&stack0xffffffffffffffcc;
              uVar5 = CollationElementIterator::next(this_00,&stack0xffffffffffffffcc);
            }
            while (uVar6 < 0x10000) {
              prefix = (UnicodeString *)&stack0xffffffffffffffcc;
              uVar6 = CollationElementIterator::next(this_01,&stack0xffffffffffffffcc);
            }
            if (uVar6 == 0xffffffff) break;
            if ((uVar5 == 0xffffffff) || (0xffff < (uVar6 ^ uVar5))) goto LAB_00258e6e;
            uVar5 = CollationElementIterator::next(this_00,&stack0xffffffffffffffcc);
            prefix = (UnicodeString *)&stack0xffffffffffffffcc;
            uVar6 = CollationElementIterator::next(this_01,&stack0xffffffffffffffcc);
          }
          iVar7 = CollationElementIterator::getOffset(this_00);
          iVar7 = iVar7 - (uint)(uVar5 != 0xffffffff);
        }
LAB_00258e6e:
        if (this_01 != (CollationElementIterator *)0x0) {
          CollationElementIterator::~CollationElementIterator(this_01);
          UMemory::operator_delete((UMemory *)this_01,prefix);
        }
        if (this_00 != (CollationElementIterator *)0x0) {
          CollationElementIterator::~CollationElementIterator(this_00);
          UMemory::operator_delete((UMemory *)this_00,prefix);
        }
      }
    }
  }
  return iVar7;
}

Assistant:

int32_t
NFRule::prefixLength(const UnicodeString& str, const UnicodeString& prefix, UErrorCode& status) const
{
    // if we're looking for an empty prefix, it obviously matches
    // zero characters.  Just go ahead and return 0.
    if (prefix.length() == 0) {
        return 0;
    }

#if !UCONFIG_NO_COLLATION
    // go through all this grief if we're in lenient-parse mode
    if (formatter->isLenient()) {
        // get the formatter's collator and use it to create two
        // collation element iterators, one over the target string
        // and another over the prefix (right now, we'll throw an
        // exception if the collator we get back from the formatter
        // isn't a RuleBasedCollator, because RuleBasedCollator defines
        // the CollationElementIterator protocol.  Hopefully, this
        // will change someday.)
        const RuleBasedCollator* collator = formatter->getCollator();
        if (collator == NULL) {
            status = U_MEMORY_ALLOCATION_ERROR;
            return 0;
        }
        LocalPointer<CollationElementIterator> strIter(collator->createCollationElementIterator(str));
        LocalPointer<CollationElementIterator> prefixIter(collator->createCollationElementIterator(prefix));
        // Check for memory allocation error.
        if (strIter.isNull() || prefixIter.isNull()) {
            status = U_MEMORY_ALLOCATION_ERROR;
            return 0;
        }

        UErrorCode err = U_ZERO_ERROR;

        // The original code was problematic.  Consider this match:
        // prefix = "fifty-"
        // string = " fifty-7"
        // The intent is to match string up to the '7', by matching 'fifty-' at position 1
        // in the string.  Unfortunately, we were getting a match, and then computing where
        // the match terminated by rematching the string.  The rematch code was using as an
        // initial guess the substring of string between 0 and prefix.length.  Because of
        // the leading space and trailing hyphen (both ignorable) this was succeeding, leaving
        // the position before the hyphen in the string.  Recursing down, we then parsed the
        // remaining string '-7' as numeric.  The resulting number turned out as 43 (50 - 7).
        // This was not pretty, especially since the string "fifty-7" parsed just fine.
        //
        // We have newer APIs now, so we can use calls on the iterator to determine what we
        // matched up to.  If we terminate because we hit the last element in the string,
        // our match terminates at this length.  If we terminate because we hit the last element
        // in the target, our match terminates at one before the element iterator position.

        // match collation elements between the strings
        int32_t oStr = strIter->next(err);
        int32_t oPrefix = prefixIter->next(err);

        while (oPrefix != CollationElementIterator::NULLORDER) {
            // skip over ignorable characters in the target string
            while (CollationElementIterator::primaryOrder(oStr) == 0
                && oStr != CollationElementIterator::NULLORDER) {
                oStr = strIter->next(err);
            }

            // skip over ignorable characters in the prefix
            while (CollationElementIterator::primaryOrder(oPrefix) == 0
                && oPrefix != CollationElementIterator::NULLORDER) {
                oPrefix = prefixIter->next(err);
            }

            // dlf: move this above following test, if we consume the
            // entire target, aren't we ok even if the source was also
            // entirely consumed?

            // if skipping over ignorables brought to the end of
            // the prefix, we DID match: drop out of the loop
            if (oPrefix == CollationElementIterator::NULLORDER) {
                break;
            }

            // if skipping over ignorables brought us to the end
            // of the target string, we didn't match and return 0
            if (oStr == CollationElementIterator::NULLORDER) {
                return 0;
            }

            // match collation elements from the two strings
            // (considering only primary differences).  If we
            // get a mismatch, dump out and return 0
            if (CollationElementIterator::primaryOrder(oStr)
                != CollationElementIterator::primaryOrder(oPrefix)) {
                return 0;

                // otherwise, advance to the next character in each string
                // and loop (we drop out of the loop when we exhaust
                // collation elements in the prefix)
            } else {
                oStr = strIter->next(err);
                oPrefix = prefixIter->next(err);
            }
        }

        int32_t result = strIter->getOffset();
        if (oStr != CollationElementIterator::NULLORDER) {
            --result; // back over character that we don't want to consume;
        }

#ifdef RBNF_DEBUG
        fprintf(stderr, "prefix length: %d\n", result);
#endif
        return result;
#if 0
        //----------------------------------------------------------------
        // JDK 1.2-specific API call
        // return strIter.getOffset();
        //----------------------------------------------------------------
        // JDK 1.1 HACK (take out for 1.2-specific code)

        // if we make it to here, we have a successful match.  Now we
        // have to find out HOW MANY characters from the target string
        // matched the prefix (there isn't necessarily a one-to-one
        // mapping between collation elements and characters).
        // In JDK 1.2, there's a simple getOffset() call we can use.
        // In JDK 1.1, on the other hand, we have to go through some
        // ugly contortions.  First, use the collator to compare the
        // same number of characters from the prefix and target string.
        // If they're equal, we're done.
        collator->setStrength(Collator::PRIMARY);
        if (str.length() >= prefix.length()) {
            UnicodeString temp;
            temp.setTo(str, 0, prefix.length());
            if (collator->equals(temp, prefix)) {
#ifdef RBNF_DEBUG
                fprintf(stderr, "returning: %d\n", prefix.length());
#endif
                return prefix.length();
            }
        }

        // if they're not equal, then we have to compare successively
        // larger and larger substrings of the target string until we
        // get to one that matches the prefix.  At that point, we know
        // how many characters matched the prefix, and we can return.
        int32_t p = 1;
        while (p <= str.length()) {
            UnicodeString temp;
            temp.setTo(str, 0, p);
            if (collator->equals(temp, prefix)) {
                return p;
            } else {
                ++p;
            }
        }

        // SHOULD NEVER GET HERE!!!
        return 0;
        //----------------------------------------------------------------
#endif

        // If lenient parsing is turned off, forget all that crap above.
        // Just use String.startsWith() and be done with it.
  } else
#endif
  {
      if (str.startsWith(prefix)) {
          return prefix.length();
      } else {
          return 0;
      }
  }
}